

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::AppendProperty
          (cmTarget *this,string *prop,string *value,optional<cmListFileBacktrace> *bt,bool asString
          )

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  cmValue cVar8;
  undefined1 in_R9B;
  basic_string_view<char,_std::char_traits<char>_> __str;
  ostringstream e;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar6 = std::__cxx11::string::compare((char *)prop);
  if (iVar6 == 0) {
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"NAME property is read-only\n","");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return;
    }
LAB_001ffce0:
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    return;
  }
  iVar6 = std::__cxx11::string::compare((char *)prop);
  if ((iVar6 == 0) &&
     (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"EXPORT_NAME property can\'t be set on imported targets (\"",
               0x38);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                        *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_228);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if ((iVar6 == 0) &&
       (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"SOURCES property can\'t be set on imported targets (\"",0x34)
      ;
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                          *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
      pcVar2 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_228);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)prop);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)prop);
        if (iVar6 == 0) {
          if (value->_M_string_length == 0) {
            return;
          }
          cmTargetInternals::GetBacktrace
                    ((cmTargetInternals *)local_1a8,
                     (optional<cmListFileBacktrace> *)
                     (this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,value,(cmListFileBacktrace *)local_1a8);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)prop);
          if (iVar6 == 0) {
            if (value->_M_string_length == 0) {
              return;
            }
            cmTargetInternals::GetBacktrace
                      ((cmTargetInternals *)local_1a8,
                       (optional<cmListFileBacktrace> *)
                       (this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileOptionsEntries,value,(cmListFileBacktrace *)local_1a8);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)prop);
            if (iVar6 == 0) {
              if (value->_M_string_length == 0) {
                return;
              }
              cmTargetInternals::GetBacktrace
                        ((cmTargetInternals *)local_1a8,
                         (optional<cmListFileBacktrace> *)
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)&((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             CompileFeaturesEntries,value,(cmListFileBacktrace *)local_1a8);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)prop);
              if (iVar6 == 0) {
                if (value->_M_string_length == 0) {
                  return;
                }
                cmTargetInternals::GetBacktrace
                          ((cmTargetInternals *)local_1a8,
                           (optional<cmListFileBacktrace> *)
                           (this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               CompileDefinitionsEntries,value,(cmListFileBacktrace *)local_1a8);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)prop);
                if (iVar6 == 0) {
                  if (value->_M_string_length == 0) {
                    return;
                  }
                  cmTargetInternals::GetBacktrace
                            ((cmTargetInternals *)local_1a8,
                             (optional<cmListFileBacktrace> *)
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              *)&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 LinkOptionsEntries,value,(cmListFileBacktrace *)local_1a8);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)prop);
                  if (iVar6 == 0) {
                    if (value->_M_string_length == 0) {
                      return;
                    }
                    cmTargetInternals::GetBacktrace
                              ((cmTargetInternals *)local_1a8,
                               (optional<cmListFileBacktrace> *)
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->LinkDirectoriesEntries,value,(cmListFileBacktrace *)local_1a8);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)prop);
                    if (iVar6 == 0) {
                      local_1a8._0_8_ = local_1a8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1a8,"PRECOMPILE_HEADERS_REUSE_FROM","");
                      cVar8 = GetProperty(this,(string *)local_1a8);
                      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                      }
                      if (cVar8.Value != (string *)0x0) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "PRECOMPILE_HEADERS_REUSE_FROM property is already set on target (\""
                                   ,0x42);
                        _Var1._M_head_impl =
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_1a8,
                                            ((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
                        pcVar2 = ((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_228);
                        goto LAB_001ffd6c;
                      }
                      if (value->_M_string_length == 0) {
                        return;
                      }
                      cmTargetInternals::GetBacktrace
                                ((cmTargetInternals *)local_1a8,
                                 (optional<cmListFileBacktrace> *)
                                 (this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->PrecompileHeadersEntries,value,
                                 (cmListFileBacktrace *)local_1a8);
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)prop);
                      if (iVar6 == 0) {
                        if (value->_M_string_length == 0) {
                          return;
                        }
                        cmTargetInternals::GetBacktrace
                                  ((cmTargetInternals *)local_1a8,
                                   (optional<cmListFileBacktrace> *)
                                   (this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->LinkImplementationPropertyEntries,value,
                                   (cmListFileBacktrace *)local_1a8);
                      }
                      else {
                        _Var4 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
                        if (_Var4) {
                          if (value->_M_string_length == 0) {
                            return;
                          }
                          cmTargetInternals::GetBacktrace
                                    ((cmTargetInternals *)local_1a8,
                                     (optional<cmListFileBacktrace> *)
                                     (this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                    );
                          std::
                          vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                      *)&((this->impl)._M_t.
                                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                          .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl)->LinkInterfacePropertyEntries,value,
                                     (cmListFileBacktrace *)local_1a8);
                        }
                        else {
                          _Var4 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_)
                          ;
                          if (_Var4) {
                            if (value->_M_string_length == 0) {
                              return;
                            }
                            cmTargetInternals::GetBacktrace
                                      ((cmTargetInternals *)local_1a8,
                                       (optional<cmListFileBacktrace> *)
                                       (this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl);
                            std::
                            vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                        *)&((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->LinkInterfaceDirectPropertyEntries,value,
                                       (cmListFileBacktrace *)local_1a8);
                          }
                          else {
                            _Var4 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                                                                          
                                                  propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_
                                                  );
                            if (_Var4) {
                              if (value->_M_string_length == 0) {
                                return;
                              }
                              cmTargetInternals::GetBacktrace
                                        ((cmTargetInternals *)local_1a8,
                                         (optional<cmListFileBacktrace> *)
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl);
                              std::
                              vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                          *)&((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->
                                             LinkInterfaceDirectExcludePropertyEntries,value,
                                         (cmListFileBacktrace *)local_1a8);
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)prop);
                              if (iVar6 != 0) {
                                local_1a8._8_8_ = (prop->_M_dataplus)._M_p;
                                local_1a8._0_8_ = prop->_M_string_length;
                                __str._M_str = "IMPORTED_LIBNAME";
                                __str._M_len = 0x10;
                                iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::
                                        compare((basic_string_view<char,_std::char_traits<char>_> *)
                                                local_1a8,0,0x10,__str);
                                if (iVar6 == 0) {
                                  pcVar2 = ((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Makefile;
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1a8,prop," property may not be APPENDed.")
                                  ;
                                  cmMakefile::IssueMessage
                                            (pcVar2,FATAL_ERROR,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_1a8);
                                }
                                else {
                                  iVar6 = std::__cxx11::string::compare((char *)prop);
                                  if ((((iVar6 != 0) &&
                                       (iVar6 = std::__cxx11::string::compare((char *)prop),
                                       iVar6 != 0)) &&
                                      (iVar6 = std::__cxx11::string::compare((char *)prop),
                                      iVar6 != 0)) &&
                                     (((iVar6 = std::__cxx11::string::compare((char *)prop),
                                       iVar6 != 0 &&
                                       (iVar6 = std::__cxx11::string::compare((char *)prop),
                                       iVar6 != 0)) &&
                                      (iVar6 = std::__cxx11::string::compare((char *)prop),
                                      iVar6 != 0)))) {
                                    _Var1._M_head_impl =
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl;
                                    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                                    pcVar3 = (value->_M_dataplus)._M_p;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_1c8,pcVar3,
                                               pcVar3 + value->_M_string_length);
                                    bVar5 = (anonymous_namespace)::FileSetType::
                                            WriteProperties<std::__cxx11::string>
                                                      ((FileSetType *)
                                                       &(_Var1._M_head_impl)->HeadersFileSets,this,
                                                       _Var1._M_head_impl,prop,&local_1c8,
                                                       (bool)in_R9B);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                                      operator_delete(local_1c8._M_dataplus._M_p,
                                                      local_1c8.field_2._M_allocated_capacity + 1);
                                    }
                                    if (bVar5) {
                                      return;
                                    }
                                    _Var1._M_head_impl =
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl;
                                    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                                    pcVar3 = (value->_M_dataplus)._M_p;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_1e8,pcVar3,
                                               pcVar3 + value->_M_string_length);
                                    bVar5 = (anonymous_namespace)::FileSetType::
                                            WriteProperties<std::__cxx11::string>
                                                      ((FileSetType *)
                                                       &(_Var1._M_head_impl)->CxxModulesFileSets,
                                                       this,_Var1._M_head_impl,prop,&local_1e8,
                                                       (bool)in_R9B);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                                      operator_delete(local_1e8._M_dataplus._M_p,
                                                      local_1e8.field_2._M_allocated_capacity + 1);
                                    }
                                    if (bVar5) {
                                      return;
                                    }
                                    _Var1._M_head_impl =
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl;
                                    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                                    pcVar3 = (value->_M_dataplus)._M_p;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_208,pcVar3,
                                               pcVar3 + value->_M_string_length);
                                    bVar5 = (anonymous_namespace)::FileSetType::
                                            WriteProperties<std::__cxx11::string>
                                                      ((FileSetType *)
                                                       &(_Var1._M_head_impl)->
                                                        CxxModuleHeadersFileSets,this,
                                                       _Var1._M_head_impl,prop,&local_208,
                                                       (bool)in_R9B);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_208._M_dataplus._M_p != &local_208.field_2) {
                                      operator_delete(local_208._M_dataplus._M_p,
                                                      local_208.field_2._M_allocated_capacity + 1);
                                    }
                                    if (bVar5) {
                                      return;
                                    }
                                    cmPropertyMap::AppendProperty
                                              (&((this->impl)._M_t.
                                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                                _M_head_impl)->Properties,prop,value,asString);
                                    return;
                                  }
                                  pcVar2 = ((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Makefile;
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1a8,prop," property may not be appended.")
                                  ;
                                  cmMakefile::IssueMessage
                                            (pcVar2,FATAL_ERROR,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_1a8);
                                }
                                if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
                                  return;
                                }
                                goto LAB_001ffce0;
                              }
                              cmTargetInternals::GetBacktrace
                                        ((cmTargetInternals *)local_1a8,
                                         (optional<cmListFileBacktrace> *)
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl);
                              std::
                              vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                          *)&((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->SourceEntries,value,
                                         (cmListFileBacktrace *)local_1a8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((cmMakefile *)local_1a8._8_8_ == (cmMakefile *)0x0) {
          return;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\"",
                 0x4b);
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                          *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
      pcVar2 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_228);
    }
  }
LAB_001ffd6c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop,
                              const std::string& value,
                              cm::optional<cmListFileBacktrace> const& bt,
                              bool asString)
{
  if (prop == "NAME") {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "PRECOMPILE_HEADERS") {
    if (this->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS_REUSE_FROM property is already set on target "
           "(\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
    this->impl->SourceEntries.emplace_back(value, lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR, prop + " property may not be APPENDed.");
  } else if (prop == "C_STANDARD" || prop == "CXX_STANDARD" ||
             prop == "CUDA_STANDARD" || prop == "HIP_STANDARD" ||
             prop == "OBJC_STANDARD" || prop == "OBJCXX_STANDARD") {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR, prop + " property may not be appended.");
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value,
               false)) { // NOLINT(bugprone-branch-clone)
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, false)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, false)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.AppendProperty(prop, value, asString);
  }
}